

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O1

c_v64 simd_test_sse2::c_imm_v64_shr_n_u8<2>(c_v64 a)

{
  return (c_v64)(CONCAT26(a.u16[3] >> 2,
                          CONCAT24(a.u16[2] >> 2,CONCAT22(a.u16[1] >> 2,a.u16[0] >> 2))) &
                (ulong)DAT_00c1e170);
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u8(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 7) {
    fprintf(stderr, "Error: Undefined u8 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 8; c++) t.u8[c] = a.u8[c] >> n;
  return t;
}